

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::FragmentShaderParameters::FragmentShaderParameters
          (FragmentShaderParameters *this,ShaderOutputs paramsOutputTotal,
          ShaderUniforms paramsUniformTotal,ComparisonFunction *paramsComparisonFunction,
          Blending paramsBlendRequired,Toggling paramsToggleRequired)

{
  this->outputTotal = paramsOutputTotal;
  this->uniformTotal = paramsUniformTotal;
  (this->functionName)._M_dataplus._M_p = (pointer)&(this->functionName).field_2;
  (this->functionName)._M_string_length = 0;
  (this->functionName).field_2._M_local_buf[0] = '\0';
  (this->functionImplementation)._M_dataplus._M_p = (pointer)&(this->functionImplementation).field_2
  ;
  (this->functionImplementation)._M_string_length = 0;
  (this->functionImplementation).field_2._M_local_buf[0] = '\0';
  this->blendRequired = paramsBlendRequired;
  this->toggleRequired = paramsToggleRequired;
  (this->uniformsToToggle).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->uniformsToToggle).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->uniformsToToggle).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (paramsComparisonFunction != (ComparisonFunction *)0x0) {
    std::__cxx11::string::_M_assign((string *)&this->functionName);
    this->functionParameters = paramsComparisonFunction->parameters;
    std::__cxx11::string::_M_assign((string *)&this->functionImplementation);
  }
  this->hasFunction = paramsComparisonFunction != (ComparisonFunction *)0x0;
  return;
}

Assistant:

FragmentShaderParameters::FragmentShaderParameters	(const ShaderOutputs	paramsOutputTotal,
													 const ShaderUniforms	paramsUniformTotal,
													 ComparisonFunction*	paramsComparisonFunction,
													 Blending				paramsBlendRequired,
													 Toggling				paramsToggleRequired)
	: outputTotal									(paramsOutputTotal)
	, uniformTotal									(paramsUniformTotal)
	, blendRequired									(paramsBlendRequired)
	, toggleRequired								(paramsToggleRequired)
{
	if (paramsComparisonFunction != DE_NULL)
	{
		functionName			= paramsComparisonFunction->name;
		functionParameters		= paramsComparisonFunction->parameters;
		functionImplementation	= paramsComparisonFunction->implementation;

		hasFunction = true;
	}
	else
	{
		hasFunction = false;
	}
}